

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O0

void __thiscall sf::priv::GlContext::cleanupUnsharedResources(GlContext *this)

{
  bool bVar1;
  GlContext *pGVar2;
  pointer ppVar3;
  GlContext *in_RDI;
  iterator iter;
  GlContext *contextToRestore;
  set<std::pair<void_(*)(void_*),_void_*>,_std::less<std::pair<void_(*)(void_*),_void_*>_>,_std::allocator<std::pair<void_(*)(void_*),_void_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Rb_tree_const_iterator<std::pair<void_(*)(void_*),_void_*>_> *this_00;
  _Self local_20;
  _Self local_18;
  GlContext *this_01;
  
  this_01 = in_RDI;
  pGVar2 = ThreadLocalPtr::operator_cast_to_GlContext_
                     ((ThreadLocalPtr<sf::priv::GlContext> *)0x2f02ff);
  if (pGVar2 == in_RDI) {
    pGVar2 = (GlContext *)0x0;
  }
  setActive(this_01,SUB81((ulong)pGVar2 >> 0x38,0));
  local_18._M_node =
       (_Base_ptr)
       std::
       set<std::pair<void_(*)(void_*),_void_*>,_std::less<std::pair<void_(*)(void_*),_void_*>_>,_std::allocator<std::pair<void_(*)(void_*),_void_*>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         set<std::pair<void_(*)(void_*),_void_*>,_std::less<std::pair<void_(*)(void_*),_void_*>_>,_std::allocator<std::pair<void_(*)(void_*),_void_*>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<void_(*)(void_*),_void_*>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<void_(*)(void_*),_void_*>_> *)0x2f036c);
    this_00 = (_Rb_tree_const_iterator<std::pair<void_(*)(void_*),_void_*>_> *)ppVar3->first;
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<void_(*)(void_*),_void_*>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<void_(*)(void_*),_void_*>_> *)0x2f037e);
    (*(code *)this_00)(ppVar3->second);
    std::_Rb_tree_const_iterator<std::pair<void_(*)(void_*),_void_*>_>::operator++(this_00);
  }
  if (pGVar2 != (GlContext *)0x0) {
    setActive(this_01,SUB81((ulong)pGVar2 >> 0x38,0));
  }
  return;
}

Assistant:

void GlContext::cleanupUnsharedResources()
{
    using GlContextImpl::currentContext;
    using GlContextImpl::ContextDestroyCallbacks;
    using GlContextImpl::contextDestroyCallbacks;

    // Save the current context so we can restore it later
    GlContext* contextToRestore = currentContext;

    // If this context is already active there is no need to save it
    if (contextToRestore == this)
        contextToRestore = NULL;

    // Make this context active so resources can be freed
    setActive(true);

    // Call the registered destruction callbacks
    for (ContextDestroyCallbacks::iterator iter = contextDestroyCallbacks.begin(); iter != contextDestroyCallbacks.end(); ++iter)
        iter->first(iter->second);

    // Make the originally active context active again
    if (contextToRestore)
        contextToRestore->setActive(true);
}